

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O2

REF_STATUS
ref_gather_node_tec_part
          (REF_NODE ref_node,REF_GLOB nnode,REF_GLOB *l2c,REF_INT ldim,REF_DBL *scalar,FILE *file)

{
  size_t sVar1;
  REF_MPI ref_mpi;
  REF_DBL *pRVar2;
  int iVar3;
  REF_STATUS RVar4;
  int iVar5;
  ulong uVar6;
  REF_INT *sorted_index;
  REF_GLOB *original;
  void *pvVar7;
  void *__ptr;
  long lVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  undefined8 uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  REF_INT n;
  char *pcVar17;
  uint uVar18;
  REF_STATUS ref_private_macro_code_rxs;
  double *pdVar19;
  int iVar20;
  ulong uVar21;
  void *pvVar22;
  double dVar23;
  double dVar24;
  long local_f0;
  uint local_dc;
  REF_INT position;
  long local_88;
  double *local_80;
  long local_78;
  REF_GLOB local_70;
  FILE *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  void *local_48;
  long local_40;
  REF_DBL *local_38;
  
  ref_mpi = ref_node->ref_mpi;
  uVar18 = ldim + 3;
  uVar6 = 0;
  uVar14 = (ulong)(uint)ref_node->max;
  if (ref_node->max < 1) {
    uVar14 = uVar6;
  }
  uVar10 = 0;
  for (; uVar14 != uVar6; uVar6 = uVar6 + 1) {
    if (l2c[uVar6] != -1) {
      uVar10 = uVar10 + (ref_mpi->id == ref_node->part[uVar6]);
    }
  }
  local_68 = (FILE *)file;
  if ((int)uVar10 < 0) {
    pcVar17 = "malloc sorted_local of REF_INT negative";
    uVar13 = 0x96;
LAB_0016b772:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar13
           ,"ref_gather_node_tec_part",pcVar17);
    RVar4 = 1;
  }
  else {
    sVar1 = (ulong)uVar10 * 4;
    local_70 = nnode;
    local_38 = scalar;
    sorted_index = (REF_INT *)malloc(sVar1);
    if (sorted_index == (REF_INT *)0x0) {
      pcVar17 = "malloc sorted_local of REF_INT NULL";
      uVar13 = 0x96;
    }
    else {
      original = (REF_GLOB *)malloc((ulong)uVar10 << 3);
      if (original == (REF_GLOB *)0x0) {
        pcVar17 = "malloc sorted_cellnode of REF_GLOB NULL";
        uVar13 = 0x97;
      }
      else {
        pvVar7 = malloc(sVar1);
        if (pvVar7 == (void *)0x0) {
          pcVar17 = "malloc pack of REF_INT NULL";
          uVar13 = 0x98;
        }
        else {
          iVar3 = ldim + 4;
          uVar15 = 0;
          for (uVar6 = 0; n = (REF_INT)uVar15, uVar14 != uVar6; uVar6 = uVar6 + 1) {
            if ((l2c[uVar6] != -1) && (ref_mpi->id == ref_node->part[uVar6])) {
              original[n] = l2c[uVar6];
              *(int *)((long)pvVar7 + (long)n * 4) = (int)uVar6;
              uVar15 = (ulong)(n + 1);
            }
          }
          uVar10 = ref_sort_heap_glob(n,original,sorted_index);
          if (uVar10 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xa3,"ref_gather_node_tec_part",(ulong)uVar10,"sort");
            return uVar10;
          }
          uVar6 = 0;
          uVar14 = 0;
          if (0 < n) {
            uVar14 = uVar15;
          }
          for (; uVar14 != uVar6; uVar6 = uVar6 + 1) {
            iVar20 = *(int *)((long)pvVar7 + (long)sorted_index[uVar6] * 4);
            sorted_index[uVar6] = iVar20;
            original[uVar6] = l2c[iVar20];
          }
          free(pvVar7);
          iVar5 = (int)(local_70 / (long)ref_mpi->n) + 1;
          iVar20 = 100000;
          if (100000 < iVar5) {
            iVar20 = iVar5;
          }
          if ((0 < ref_mpi->reduce_byte_limit) &&
             (iVar5 = ref_mpi->reduce_byte_limit / (iVar3 * 8), iVar5 <= iVar20)) {
            iVar20 = iVar5;
          }
          if (iVar20 * iVar3 < 0) {
            pcVar17 = "malloc local_xyzm of REF_DBL negative";
            uVar13 = 0xaf;
            goto LAB_0016b772;
          }
          local_50 = (ulong)(uint)(iVar20 * iVar3);
          sVar1 = local_50 * 8;
          pvVar7 = malloc(sVar1);
          if (pvVar7 == (void *)0x0) {
            pcVar17 = "malloc local_xyzm of REF_DBL NULL";
            uVar13 = 0xaf;
          }
          else {
            __ptr = malloc(sVar1);
            if (__ptr != (void *)0x0) {
              uVar14 = 0;
              if (0 < ldim) {
                uVar14 = (ulong)(uint)ldim;
              }
              local_60 = (ulong)iVar20;
              lVar12 = (long)iVar3;
              uVar6 = 0;
              if (0 < (int)uVar18) {
                uVar6 = (ulong)uVar18;
              }
              local_80 = (double *)((long)pvVar7 + (long)(int)uVar18 * 8);
              local_48 = (void *)((long)__ptr + (long)(int)uVar18 * 8);
              local_40 = lVar12 << 0x20;
              local_dc = 0;
              lVar11 = 0;
              local_78 = lVar12;
              while( true ) {
                lVar8 = lVar11;
                uVar15 = local_70 - lVar8;
                if (uVar15 == 0 || local_70 < lVar8) {
                  free(__ptr);
                  free(pvVar7);
                  free(original);
                  free(sorted_index);
                  return 0;
                }
                local_58 = uVar15;
                if ((long)local_60 <= (long)uVar15) {
                  local_58 = local_60;
                }
                for (uVar15 = 0; local_50 != uVar15; uVar15 = uVar15 + 1) {
                  *(undefined8 *)((long)pvVar7 + uVar15 * 8) = 0;
                }
                local_88 = (int)local_58 + lVar8;
                uVar15 = 0;
                if (0 < (int)local_58) {
                  uVar15 = local_58 & 0xffffffff;
                }
                local_f0 = 0x300000000;
                for (uVar21 = 0; uVar21 != uVar15; uVar21 = uVar21 + 1) {
                  uVar18 = ref_sort_search_glob(n,original,lVar8 + uVar21,&position);
                  if ((uVar18 != 0) && (uVar18 != 5)) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0xbf,"ref_gather_node_tec_part",(ulong)uVar18,"node local failed");
                    local_dc = uVar18;
                  }
                  if (uVar18 != 5) {
                    if (uVar18 != 0) {
                      return local_dc;
                    }
                    iVar20 = sorted_index[position];
                    lVar11 = (long)iVar20;
                    pRVar2 = ref_node->real;
                    lVar9 = uVar21 * local_78;
                    *(REF_DBL *)((long)pvVar7 + lVar9 * 8) = pRVar2[lVar11 * 0xf];
                    *(REF_DBL *)((long)pvVar7 + lVar9 * 8 + 8) = pRVar2[lVar11 * 0xf + 1];
                    *(REF_DBL *)((long)pvVar7 + lVar9 * 8 + 0x10) = pRVar2[lVar11 * 0xf + 2];
                    lVar11 = local_f0;
                    for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
                      *(REF_DBL *)((long)pvVar7 + (lVar11 >> 0x1d)) =
                           local_38[(long)(iVar20 * ldim) + uVar16];
                      lVar11 = lVar11 + 0x100000000;
                    }
                    local_80[lVar9] = 1.0;
                  }
                  local_f0 = local_f0 + local_40;
                }
                lVar11 = lVar8;
                pdVar19 = local_80;
                for (lVar9 = -uVar15; lVar9 != 0; lVar9 = lVar9 + 1) {
                  dVar24 = *pdVar19;
                  dVar23 = dVar24 + -1.0;
                  if (dVar23 <= -dVar23) {
                    dVar23 = -dVar23;
                  }
                  if (0.1 < dVar23) {
                    if (dVar24 <= -dVar24) {
                      dVar24 = -dVar24;
                    }
                    if (0.1 < dVar24) {
                      printf("%s: %d: %s: before sum %ld %f\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0xd0,"ref_gather_node_tec_part",lVar11);
                    }
                  }
                  lVar11 = lVar11 + 1;
                  pdVar19 = pdVar19 + lVar12;
                }
                uVar18 = ref_mpi_sum(ref_mpi,pvVar7,__ptr,(int)local_58 * iVar3,3);
                if (uVar18 != 0) break;
                lVar11 = local_88;
                if (ref_mpi->id == 0) {
                  pvVar22 = __ptr;
                  for (uVar21 = 0; lVar11 = local_88, uVar21 != uVar15; uVar21 = uVar21 + 1) {
                    dVar24 = *(double *)((long)local_48 + uVar21 * local_78 * 8) + -1.0;
                    if (dVar24 <= -dVar24) {
                      dVar24 = -dVar24;
                    }
                    if (0.1 < dVar24) {
                      printf("%s: %d: %s: after sum %ld %f\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0xda,"ref_gather_node_tec_part",lVar8 + uVar21);
                    }
                    for (uVar16 = 0; uVar6 != uVar16; uVar16 = uVar16 + 1) {
                      fprintf(local_68," %.15e",*(undefined8 *)((long)pvVar22 + uVar16 * 8));
                    }
                    fwrite(" \n",2,1,local_68);
                    pvVar22 = (void *)((long)pvVar22 + lVar12 * 8);
                  }
                }
              }
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xd4,"ref_gather_node_tec_part",(ulong)uVar18,"sum");
              return uVar18;
            }
            pcVar17 = "malloc xyzm of REF_DBL NULL";
            uVar13 = 0xb0;
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar13
           ,"ref_gather_node_tec_part",pcVar17);
    RVar4 = 2;
  }
  return RVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_node_tec_part(REF_NODE ref_node,
                                                   REF_GLOB nnode,
                                                   REF_GLOB *l2c, REF_INT ldim,
                                                   REF_DBL *scalar,
                                                   FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT chunk;
  REF_DBL *local_xyzm, *xyzm;
  REF_GLOB nnode_written, first, global;
  REF_INT local, n, i, id;
  REF_STATUS status;
  REF_INT dim = 3 + ldim + 1;
  REF_INT *sorted_local, *pack, total_cellnode, position;
  REF_GLOB *sorted_cellnode;

  total_cellnode = 0;
  for (i = 0; i < ref_node_max(ref_node); i++) {
    if (REF_EMPTY != l2c[i] && ref_node_owned(ref_node, i)) {
      total_cellnode++;
    }
  }

  ref_malloc(sorted_local, total_cellnode, REF_INT);
  ref_malloc(sorted_cellnode, total_cellnode, REF_GLOB);
  ref_malloc(pack, total_cellnode, REF_INT);

  total_cellnode = 0;
  for (i = 0; i < ref_node_max(ref_node); i++) {
    if (REF_EMPTY != l2c[i] && ref_node_owned(ref_node, i)) {
      sorted_cellnode[total_cellnode] = l2c[i];
      pack[total_cellnode] = i;
      total_cellnode++;
    }
  }
  RSS(ref_sort_heap_glob(total_cellnode, sorted_cellnode, sorted_local),
      "sort");
  for (i = 0; i < total_cellnode; i++) {
    sorted_local[i] = pack[sorted_local[i]];
    sorted_cellnode[i] = l2c[sorted_local[i]];
  }
  ref_free(pack);

  chunk = (REF_INT)(nnode / ref_mpi_n(ref_mpi) + 1);
  chunk = MAX(chunk, 100000);
  chunk = MIN(chunk, ref_mpi_reduce_chunk_limit(
                         ref_mpi, dim * (REF_INT)sizeof(REF_DBL)));

  ref_malloc(local_xyzm, dim * chunk, REF_DBL);
  ref_malloc(xyzm, dim * chunk, REF_DBL);

  nnode_written = 0;
  while (nnode_written < nnode) {
    first = nnode_written;
    n = (REF_INT)MIN((REF_GLOB)chunk, nnode - nnode_written);

    nnode_written += n;

    for (i = 0; i < dim * chunk; i++) local_xyzm[i] = 0.0;

    for (i = 0; i < n; i++) {
      global = first + i;
      status = ref_sort_search_glob(total_cellnode, sorted_cellnode, global,
                                    &position);
      RXS(status, REF_NOT_FOUND, "node local failed");
      if (REF_SUCCESS == status) {
        local = sorted_local[position];
        local_xyzm[0 + dim * i] = ref_node_xyz(ref_node, 0, local);
        local_xyzm[1 + dim * i] = ref_node_xyz(ref_node, 1, local);
        local_xyzm[2 + dim * i] = ref_node_xyz(ref_node, 2, local);
        for (id = 0; id < ldim; id++) {
          local_xyzm[3 + id + dim * i] = scalar[id + ldim * local];
        }
        local_xyzm[3 + ldim + dim * i] = 1.0;
      }
    }

    for (i = 0; i < n; i++) {
      if ((ABS(local_xyzm[3 + ldim + dim * i] - 1.0) > 0.1) &&
          (ABS(local_xyzm[3 + ldim + dim * i] - 0.0) > 0.1)) {
        printf("%s: %d: %s: before sum " REF_GLOB_FMT " %f\n", __FILE__,
               __LINE__, __func__, first + i, local_xyzm[3 + ldim + dim * i]);
      }
    }

    RSS(ref_mpi_sum(ref_mpi, local_xyzm, xyzm, dim * n, REF_DBL_TYPE), "sum");

    if (ref_mpi_once(ref_mpi)) {
      for (i = 0; i < n; i++) {
        if (ABS(xyzm[3 + ldim + dim * i] - 1.0) > 0.1) {
          printf("%s: %d: %s: after sum " REF_GLOB_FMT " %f\n", __FILE__,
                 __LINE__, __func__, first + i, xyzm[3 + ldim + dim * i]);
        }
        for (id = 0; id < 3 + ldim; id++) {
          fprintf(file, " %.15e", xyzm[id + dim * i]);
        }
        fprintf(file, " \n");
      }
    }
  }

  ref_free(xyzm);
  ref_free(local_xyzm);
  ref_free(sorted_cellnode);
  ref_free(sorted_local);

  return REF_SUCCESS;
}